

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8_dec.c
# Opt level: O1

int GetLargeValue(VP8BitReader *br,uint8_t *p)

{
  ulong *puVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  byte *pbVar9;
  uint uVar10;
  uint uVar11;
  range_t rVar12;
  uint uVar13;
  
  bVar6 = p[3];
  rVar12 = br->range;
  if (br->bits < 0) {
    puVar1 = (ulong *)br->buf;
    if (puVar1 < br->buf_max) {
      uVar2 = *puVar1;
      br->buf = (uint8_t *)((long)puVar1 + 7);
      br->value = br->value << 0x38 |
                  ((uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
                   (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
                   (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38) >> 8;
      br->bits = br->bits + 0x38;
    }
    else {
      VP8LoadFinalBytes(br);
    }
  }
  uVar7 = bVar6 * rVar12 >> 8;
  bVar6 = (byte)br->bits;
  uVar8 = (uint)(br->value >> (bVar6 & 0x3f));
  if (uVar7 < uVar8) {
    uVar11 = rVar12 - uVar7;
    br->value = br->value - ((ulong)uVar7 + 1 << (bVar6 & 0x3f));
  }
  else {
    uVar11 = uVar7 + 1;
  }
  uVar10 = 0x1f;
  if (uVar11 != 0) {
    for (; uVar11 >> uVar10 == 0; uVar10 = uVar10 - 1) {
    }
  }
  iVar4 = br->bits - (uVar10 ^ 7);
  rVar12 = (uVar11 << ((byte)(uVar10 ^ 7) & 0x1f)) - 1;
  br->bits = iVar4;
  br->range = rVar12;
  if (uVar7 < uVar8) {
    bVar6 = p[6];
    if (iVar4 < 0) {
      puVar1 = (ulong *)br->buf;
      if (puVar1 < br->buf_max) {
        uVar2 = *puVar1;
        br->buf = (uint8_t *)((long)puVar1 + 7);
        br->value = br->value << 0x38 |
                    ((uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
                     (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
                     (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38) >> 8;
        br->bits = iVar4 + 0x38;
      }
      else {
        VP8LoadFinalBytes(br);
      }
    }
    uVar7 = bVar6 * rVar12 >> 8;
    bVar6 = (byte)br->bits;
    uVar8 = (uint)(br->value >> (bVar6 & 0x3f));
    if (uVar7 < uVar8) {
      uVar11 = rVar12 - uVar7;
      br->value = br->value - ((ulong)uVar7 + 1 << (bVar6 & 0x3f));
    }
    else {
      uVar11 = uVar7 + 1;
    }
    uVar10 = 0x1f;
    if (uVar11 != 0) {
      for (; uVar11 >> uVar10 == 0; uVar10 = uVar10 - 1) {
      }
    }
    iVar4 = br->bits - (uVar10 ^ 7);
    rVar12 = (uVar11 << ((byte)(uVar10 ^ 7) & 0x1f)) - 1;
    br->bits = iVar4;
    br->range = rVar12;
    if (uVar7 < uVar8) {
      bVar6 = p[8];
      if (iVar4 < 0) {
        puVar1 = (ulong *)br->buf;
        if (puVar1 < br->buf_max) {
          uVar2 = *puVar1;
          br->buf = (uint8_t *)((long)puVar1 + 7);
          br->value = br->value << 0x38 |
                      ((uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
                       (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
                       (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38) >> 8;
          br->bits = iVar4 + 0x38;
        }
        else {
          VP8LoadFinalBytes(br);
        }
      }
      uVar8 = bVar6 * rVar12 >> 8;
      bVar6 = (byte)br->bits;
      uVar7 = (uint)(br->value >> (bVar6 & 0x3f));
      if (uVar8 < uVar7) {
        uVar11 = rVar12 - uVar8;
        br->value = br->value - ((ulong)uVar8 + 1 << (bVar6 & 0x3f));
      }
      else {
        uVar11 = uVar8 + 1;
      }
      uVar10 = 0x1f;
      if (uVar11 != 0) {
        for (; uVar11 >> uVar10 == 0; uVar10 = uVar10 - 1) {
        }
      }
      rVar12 = (uVar11 << ((byte)(uVar10 ^ 7) & 0x1f)) - 1;
      iVar4 = br->bits - (uVar10 ^ 7);
      br->bits = iVar4;
      br->range = rVar12;
      bVar6 = p[(ulong)(uVar8 < uVar7) + 9];
      if (iVar4 < 0) {
        puVar1 = (ulong *)br->buf;
        if (puVar1 < br->buf_max) {
          uVar2 = *puVar1;
          br->buf = (uint8_t *)((long)puVar1 + 7);
          br->value = br->value << 0x38 |
                      ((uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
                       (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
                       (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38) >> 8;
          br->bits = iVar4 + 0x38;
        }
        else {
          VP8LoadFinalBytes(br);
        }
      }
      uVar10 = bVar6 * rVar12 >> 8;
      bVar6 = (byte)br->bits;
      uVar11 = (uint)(br->value >> (bVar6 & 0x3f));
      if (uVar10 < uVar11) {
        uVar13 = rVar12 - uVar10;
        br->value = br->value - ((ulong)uVar10 + 1 << (bVar6 & 0x3f));
      }
      else {
        uVar13 = uVar10 + 1;
      }
      uVar3 = 0x1f;
      if (uVar13 != 0) {
        for (; uVar13 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      br->bits = br->bits - (uVar3 ^ 7);
      br->range = (uVar13 << ((byte)(uVar3 ^ 7) & 0x1f)) - 1;
      uVar8 = (uint)(uVar10 < uVar11) + (uint)(uVar8 < uVar7) * 2;
      pbVar9 = kCat3456[uVar8];
      bVar6 = *pbVar9;
      if (bVar6 == 0) {
        iVar4 = 0;
      }
      else {
        iVar4 = 0;
        do {
          pbVar9 = pbVar9 + 1;
          rVar12 = br->range;
          if (br->bits < 0) {
            puVar1 = (ulong *)br->buf;
            if (puVar1 < br->buf_max) {
              uVar2 = *puVar1;
              br->buf = (uint8_t *)((long)puVar1 + 7);
              br->value = br->value << 0x38 |
                          ((uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
                           (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
                           (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38) >>
                          8;
              br->bits = br->bits + 0x38;
            }
            else {
              VP8LoadFinalBytes(br);
            }
          }
          uVar7 = bVar6 * rVar12 >> 8;
          bVar6 = (byte)br->bits;
          uVar11 = (uint)(br->value >> (bVar6 & 0x3f));
          if (uVar7 < uVar11) {
            uVar10 = rVar12 - uVar7;
            br->value = br->value - ((ulong)uVar7 + 1 << (bVar6 & 0x3f));
          }
          else {
            uVar10 = uVar7 + 1;
          }
          uVar13 = 0x1f;
          if (uVar10 != 0) {
            for (; uVar10 >> uVar13 == 0; uVar13 = uVar13 - 1) {
            }
          }
          br->bits = br->bits - (uVar13 ^ 7);
          br->range = (uVar10 << ((byte)(uVar13 ^ 7) & 0x1f)) - 1;
          iVar4 = (uint)(uVar7 < uVar11) + iVar4 * 2;
          bVar6 = *pbVar9;
        } while (bVar6 != 0);
      }
      return iVar4 + (8 << (sbyte)uVar8) + 3;
    }
    bVar6 = p[7];
    if (iVar4 < 0) {
      puVar1 = (ulong *)br->buf;
      if (puVar1 < br->buf_max) {
        uVar2 = *puVar1;
        br->buf = (uint8_t *)((long)puVar1 + 7);
        br->value = br->value << 0x38 |
                    ((uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
                     (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
                     (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38) >> 8;
        br->bits = iVar4 + 0x38;
      }
      else {
        VP8LoadFinalBytes(br);
      }
    }
    uVar7 = bVar6 * rVar12 >> 8;
    bVar6 = (byte)br->bits;
    uVar8 = (uint)(br->value >> (bVar6 & 0x3f));
    if (uVar7 < uVar8) {
      uVar11 = rVar12 - uVar7;
      br->value = br->value - ((ulong)uVar7 + 1 << (bVar6 & 0x3f));
    }
    else {
      uVar11 = uVar7 + 1;
    }
    uVar10 = 0x1f;
    if (uVar11 != 0) {
      for (; uVar11 >> uVar10 == 0; uVar10 = uVar10 - 1) {
      }
    }
    iVar4 = br->bits - (uVar10 ^ 7);
    rVar12 = (uVar11 << ((byte)(uVar10 ^ 7) & 0x1f)) - 1;
    br->bits = iVar4;
    br->range = rVar12;
    if (uVar7 < uVar8) {
      if (iVar4 < 0) {
        puVar1 = (ulong *)br->buf;
        if (puVar1 < br->buf_max) {
          uVar2 = *puVar1;
          br->buf = (uint8_t *)((long)puVar1 + 7);
          br->value = br->value << 0x38 |
                      ((uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
                       (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
                       (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38) >> 8;
          br->bits = iVar4 + 0x38;
        }
        else {
          VP8LoadFinalBytes(br);
        }
      }
      uVar8 = rVar12 * 0xa5 >> 8;
      bVar6 = (byte)br->bits;
      if (uVar8 < (uint)(br->value >> (bVar6 & 0x3f))) {
        uVar7 = rVar12 - uVar8;
        br->value = br->value - ((ulong)uVar8 + 1 << (bVar6 & 0x3f));
        iVar4 = 9;
      }
      else {
        uVar7 = uVar8 + 1;
        iVar4 = 7;
      }
      uVar8 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      rVar12 = (uVar7 << ((byte)(uVar8 ^ 7) & 0x1f)) - 1;
      iVar5 = br->bits - (uVar8 ^ 7);
      br->bits = iVar5;
      br->range = rVar12;
      if (iVar5 < 0) {
        puVar1 = (ulong *)br->buf;
        if (puVar1 < br->buf_max) {
          uVar2 = *puVar1;
          br->buf = (uint8_t *)((long)puVar1 + 7);
          br->value = br->value << 0x38 |
                      ((uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
                       (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
                       (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38) >> 8;
          br->bits = iVar5 + 0x38;
        }
        else {
          VP8LoadFinalBytes(br);
        }
      }
      uVar8 = rVar12 * 0x91 >> 8;
      bVar6 = (byte)br->bits;
      uVar7 = (uint)(br->value >> (bVar6 & 0x3f));
      if (uVar8 < uVar7) {
        uVar11 = rVar12 - uVar8;
        br->value = br->value - ((ulong)uVar8 + 1 << (bVar6 & 0x3f));
      }
      else {
        uVar11 = uVar8 + 1;
      }
      uVar10 = 0x1f;
      if (uVar11 != 0) {
        for (; uVar11 >> uVar10 == 0; uVar10 = uVar10 - 1) {
        }
      }
      br->bits = br->bits - (uVar10 ^ 7);
      br->range = (uVar11 << ((byte)(uVar10 ^ 7) & 0x1f)) - 1;
      return iVar4 + (uint)(uVar8 < uVar7);
    }
    if (iVar4 < 0) {
      puVar1 = (ulong *)br->buf;
      if (puVar1 < br->buf_max) {
        uVar2 = *puVar1;
        br->buf = (uint8_t *)((long)puVar1 + 7);
        br->value = br->value << 0x38 |
                    ((uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
                     (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
                     (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38) >> 8;
        br->bits = iVar4 + 0x38;
      }
      else {
        VP8LoadFinalBytes(br);
      }
    }
    iVar4 = br->bits;
    uVar8 = rVar12 * 0x9f >> 8;
    if (uVar8 < (uint)(br->value >> ((byte)iVar4 & 0x3f))) {
      uVar7 = rVar12 - uVar8;
      br->value = br->value - ((ulong)uVar8 + 1 << ((byte)iVar4 & 0x3f));
      iVar5 = 6;
    }
    else {
      uVar7 = uVar8 + 1;
      iVar5 = 5;
    }
  }
  else {
    bVar6 = p[4];
    if (iVar4 < 0) {
      puVar1 = (ulong *)br->buf;
      if (puVar1 < br->buf_max) {
        uVar2 = *puVar1;
        br->buf = (uint8_t *)((long)puVar1 + 7);
        br->value = br->value << 0x38 |
                    ((uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
                     (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
                     (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38) >> 8;
        br->bits = iVar4 + 0x38;
      }
      else {
        VP8LoadFinalBytes(br);
      }
    }
    uVar7 = bVar6 * rVar12 >> 8;
    bVar6 = (byte)br->bits;
    uVar8 = (uint)(br->value >> (bVar6 & 0x3f));
    if (uVar7 < uVar8) {
      uVar11 = rVar12 - uVar7;
      br->value = br->value - ((ulong)uVar7 + 1 << (bVar6 & 0x3f));
    }
    else {
      uVar11 = uVar7 + 1;
    }
    uVar10 = 0x1f;
    if (uVar11 != 0) {
      for (; uVar11 >> uVar10 == 0; uVar10 = uVar10 - 1) {
      }
    }
    iVar4 = br->bits - (uVar10 ^ 7);
    rVar12 = (uVar11 << ((byte)(uVar10 ^ 7) & 0x1f)) - 1;
    br->bits = iVar4;
    br->range = rVar12;
    if (uVar8 <= uVar7) {
      return 2;
    }
    bVar6 = p[5];
    if (iVar4 < 0) {
      puVar1 = (ulong *)br->buf;
      if (puVar1 < br->buf_max) {
        uVar2 = *puVar1;
        br->buf = (uint8_t *)((long)puVar1 + 7);
        br->value = br->value << 0x38 |
                    ((uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
                     (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
                     (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38) >> 8;
        br->bits = iVar4 + 0x38;
      }
      else {
        VP8LoadFinalBytes(br);
      }
    }
    iVar4 = br->bits;
    uVar8 = bVar6 * rVar12 >> 8;
    if (uVar8 < (uint)(br->value >> ((byte)iVar4 & 0x3f))) {
      uVar7 = rVar12 - uVar8;
      br->value = br->value - ((ulong)uVar8 + 1 << ((byte)iVar4 & 0x3f));
      iVar5 = 4;
    }
    else {
      uVar7 = uVar8 + 1;
      iVar5 = 3;
    }
  }
  uVar8 = 0x1f;
  if (uVar7 != 0) {
    for (; uVar7 >> uVar8 == 0; uVar8 = uVar8 - 1) {
    }
  }
  br->bits = iVar4 - (uVar8 ^ 7);
  br->range = (uVar7 << ((byte)(uVar8 ^ 7) & 0x1f)) - 1;
  return iVar5;
}

Assistant:

static int GetLargeValue(VP8BitReader* const br, const uint8_t* const p) {
  int v;
  if (!VP8GetBit(br, p[3], "coeffs")) {
    if (!VP8GetBit(br, p[4], "coeffs")) {
      v = 2;
    } else {
      v = 3 + VP8GetBit(br, p[5], "coeffs");
    }
  } else {
    if (!VP8GetBit(br, p[6], "coeffs")) {
      if (!VP8GetBit(br, p[7], "coeffs")) {
        v = 5 + VP8GetBit(br, 159, "coeffs");
      } else {
        v = 7 + 2 * VP8GetBit(br, 165, "coeffs");
        v += VP8GetBit(br, 145, "coeffs");
      }
    } else {
      const uint8_t* tab;
      const int bit1 = VP8GetBit(br, p[8], "coeffs");
      const int bit0 = VP8GetBit(br, p[9 + bit1], "coeffs");
      const int cat = 2 * bit1 + bit0;
      v = 0;
      for (tab = kCat3456[cat]; *tab; ++tab) {
        v += v + VP8GetBit(br, *tab, "coeffs");
      }
      v += 3 + (8 << cat);
    }
  }
  return v;
}